

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *_config)

{
  StreamingReporterBase<Catch::XmlReporter>::StreamingReporterBase
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,_config);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__XmlReporter_001878b0;
  (this->m_testCaseTimer).m_nanoseconds = 0;
  XmlWriter::XmlWriter(&this->m_xml,_config->m_stream);
  this->m_sectionDepth = 0;
  (this->super_StreamingReporterBase<Catch::XmlReporter>).m_reporterPrefs.shouldRedirectStdOut =
       true;
  (this->super_StreamingReporterBase<Catch::XmlReporter>).m_reporterPrefs.shouldReportAllAssertions
       = true;
  return;
}

Assistant:

XmlReporter::XmlReporter( ReporterConfig const& _config )
    :   StreamingReporterBase( _config ),
        m_xml(_config.stream())
    {
        m_reporterPrefs.shouldRedirectStdOut = true;
        m_reporterPrefs.shouldReportAllAssertions = true;
    }